

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_qemu_ld_i32_ppc64
               (TCGContext_conflict10 *tcg_ctx,TCGv_i32 val,TCGv_i64 addr,TCGArg idx,
               MemOp_conflict memop)

{
  TCGOp *pTVar1;
  uintptr_t o;
  uintptr_t o_1;
  
  switch(memop & MO_64) {
  case MO_8:
    memop = memop & ~MO_BE;
    break;
  case MO_32:
    memop = memop & ~MO_ASHIFT;
    break;
  case MO_64:
    tcg_gen_qemu_ld_i32_ppc64_cold_1();
  }
  pTVar1 = tcg_emit_op_ppc64(tcg_ctx,INDEX_op_qemu_ld_i32);
  pTVar1->args[0] = (TCGArg)(val + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(addr + (long)tcg_ctx);
  pTVar1->args[2] = (ulong)(memop << 4 | (uint)idx);
  check_exit_request_ppc64(tcg_ctx);
  return;
}

Assistant:

void tcg_gen_qemu_ld_i32(TCGContext *tcg_ctx, TCGv_i32 val, TCGv addr, TCGArg idx, MemOp memop)
{
    MemOp orig_memop;

    tcg_gen_req_mo(tcg_ctx, TCG_MO_LD_LD | TCG_MO_ST_LD);
    memop = tcg_canonicalize_memop(memop, 0, 0);

    orig_memop = memop;
    if (!TCG_TARGET_HAS_MEMORY_BSWAP && (memop & MO_BSWAP)) {
        memop &= ~MO_BSWAP;
        /* The bswap primitive requires zero-extended input.  */
        if ((memop & MO_SSIZE) == MO_SW) {
            memop &= ~MO_SIGN;
        }
    }

    gen_ldst_i32(tcg_ctx, INDEX_op_qemu_ld_i32, val, addr, memop, idx);

    if ((orig_memop ^ memop) & MO_BSWAP) {
        switch (orig_memop & MO_SIZE) {
        case MO_16:
            tcg_gen_bswap16_i32(tcg_ctx, val, val);
            if (orig_memop & MO_SIGN) {
                tcg_gen_ext16s_i32(tcg_ctx, val, val);
            }
            break;
        case MO_32:
            tcg_gen_bswap32_i32(tcg_ctx, val, val);
            break;
        default:
            g_assert_not_reached();
        }
    }

    check_exit_request(tcg_ctx);
}